

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O0

_Bool spell_okay_list(player *p,_func__Bool_player_ptr_wchar_t *spell_test,int *spells,
                     wchar_t n_spells)

{
  _Bool _Var1;
  _Bool local_29;
  wchar_t local_28;
  _Bool okay;
  wchar_t i;
  wchar_t n_spells_local;
  int *spells_local;
  _func__Bool_player_ptr_wchar_t *spell_test_local;
  player *p_local;
  
  local_29 = false;
  for (local_28 = L'\0'; local_28 < n_spells; local_28 = local_28 + L'\x01') {
    _Var1 = (*spell_test)(p,spells[local_28]);
    if (_Var1) {
      local_29 = true;
    }
  }
  return local_29;
}

Assistant:

bool spell_okay_list(const struct player *p,
		bool (*spell_test)(const struct player *p, int spell),
		const int spells[], int n_spells)
{
	int i;
	bool okay = false;

	for (i = 0; i < n_spells; i++)
		if (spell_test(p, spells[i]))
			okay = true;

	return okay;
}